

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraALU_cpp.h
# Opt level: O3

u32 __thiscall moira::Moira::addsub<(moira::Core)1,(moira::Instr)292,2>(Moira *this,u32 op1,u32 op2)

{
  ulong uVar1;
  bool bVar2;
  
  uVar1 = (ulong)op2 - ((ulong)(this->reg).sr.x + (ulong)op1);
  bVar2 = (bool)((byte)(uVar1 >> 0x10) & 1);
  (this->reg).sr.c = bVar2;
  (this->reg).sr.x = bVar2;
  (this->reg).sr.v = (bool)((byte)(((op2 ^ (uint)uVar1) & (op1 ^ op2)) >> 0xf) & 1);
  if ((short)uVar1 != 0) {
    (this->reg).sr.z = false;
  }
  (this->reg).sr.n = (bool)((byte)(uVar1 >> 0xf) & 1);
  return (uint)uVar1;
}

Assistant:

u32
Moira::addsub(u32 op1, u32 op2)
{
    u64 result;

    switch (I) {

        case Instr::ADD:
        case Instr::ADD_LOOP:
        case Instr::ADDI:
        case Instr::ADDQ:
        {
            result = U64_ADD(op1, op2);

            reg.sr.x = reg.sr.c = CARRY<S>(result);
            reg.sr.v = NBIT<S>((op1 ^ result) & (op2 ^ result));
            reg.sr.z = ZERO<S>(result);
            break;
        }
        case Instr::ADDX:
        case Instr::ADDX_LOOP:
        {
            result = U64_ADD3(op1, op2, reg.sr.x);

            reg.sr.x = reg.sr.c = CARRY<S>(result);
            reg.sr.v = NBIT<S>((op1 ^ result) & (op2 ^ result));
            if (CLIP<S>(result)) reg.sr.z = 0;
            break;
        }
        case Instr::SUB:
        case Instr::SUB_LOOP:
        case Instr::SUBI:
        case Instr::SUBQ:
        {
            result = U64_SUB(op2, op1);

            reg.sr.x = reg.sr.c = CARRY<S>(result);
            reg.sr.v = NBIT<S>((op1 ^ op2) & (op2 ^ result));
            reg.sr.z = ZERO<S>(result);
            break;
        }
        case Instr::SUBX:
        case Instr::SUBX_LOOP:
        {
            result = U64_SUB3(op2, op1, reg.sr.x);

            reg.sr.x = reg.sr.c = CARRY<S>(result);
            reg.sr.v = NBIT<S>((op1 ^ op2) & (op2 ^ result));
            if (CLIP<S>(result)) reg.sr.z = 0;
            break;
        }

        default:
            fatalError;
    }

    reg.sr.n = NBIT<S>(result);

    return (u32)result;
}